

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_reference.h
# Opt level: O2

word_type __thiscall
bv::internal::const_range_reference::operator_cast_to_unsigned_long(const_range_reference *this)

{
  ulong uVar1;
  word_type wVar2;
  ulong end;
  
  uVar1 = 0x40 / (*(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                    **)this)->_width + *(size_t *)(this + 8);
  end = *(ulong *)(this + 0x10);
  if (uVar1 < *(ulong *)(this + 0x10)) {
    end = uVar1;
  }
  wVar2 = packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
          get(*(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                **)this,*(size_t *)(this + 8),end);
  return wVar2;
}

Assistant:

explicit operator word_type() const {
                size_t capped = std::min(_end,
                                         _begin + _v.elements_per_word());
                
                return _v.get(_begin, capped);
            }